

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int WebRtcIsac_DecodeUb12
              (TransformTables *transform_tables,float *signal_out,ISACUBDecStruct *ISACdecUB_obj,
              int16_t isRCUPayload)

{
  int16_t iVar1;
  int local_26b0;
  int n;
  int16_t kAveragePitchGain;
  double imag_f [240];
  double real_f [240];
  double percepFilterParam [30];
  double HPw [240];
  double LPw [240];
  float HP_dec_float [240];
  float LP_dec_float [240];
  int err;
  int len;
  int16_t isRCUPayload_local;
  ISACUBDecStruct *ISACdecUB_obj_local;
  float *signal_out_local;
  TransformTables *transform_tables_local;
  
  iVar1 = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,real_f + 0xef,0xc);
  transform_tables_local._4_4_ = (int)iVar1;
  if ((-1 < transform_tables_local._4_4_) &&
     (transform_tables_local._4_4_ =
           WebRtcIsac_DecodeSpec
                     (&ISACdecUB_obj->bitstr_obj,0,kIsacUpperBand12,imag_f + 0xef,(double *)&n),
     -1 < transform_tables_local._4_4_)) {
    if (isRCUPayload != 0) {
      for (local_26b0 = 0; local_26b0 < 0xf0; local_26b0 = local_26b0 + 1) {
        imag_f[(long)local_26b0 + 0xef] = imag_f[(long)local_26b0 + 0xef] * 2.0;
        *(double *)(&n + (long)local_26b0 * 2) = *(double *)(&n + (long)local_26b0 * 2) * 2.0;
      }
    }
    WebRtcIsac_Spec2time
              (transform_tables,imag_f + 0xef,(double *)&n,HPw + 0xef,percepFilterParam + 0x1d,
               &ISACdecUB_obj->fftstr_obj);
    WebRtcIsac_NormLatticeFilterAr
              (4,(ISACdecUB_obj->maskfiltstr_obj).PostStateLoF,
               (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG,HPw + 0xef,real_f + 0xef,
               HP_dec_float + 0xee);
    memset(LPw + 0xef,0,0x3c0);
    WebRtcIsac_FilterAndCombineFloat
              ((float *)(LPw + 0xef),HP_dec_float + 0xee,signal_out,
               &ISACdecUB_obj->postfiltbankstr_obj);
  }
  return transform_tables_local._4_4_;
}

Assistant:

int WebRtcIsac_DecodeUb12(const TransformTables* transform_tables,
                          float* signal_out, ISACUBDecStruct* ISACdecUB_obj,
                          int16_t isRCUPayload) {
  int len, err;

  float LP_dec_float[FRAMESAMPLES_HALF];
  float HP_dec_float[FRAMESAMPLES_HALF];

  double LPw[FRAMESAMPLES_HALF];
  double HPw[FRAMESAMPLES_HALF];

  double percepFilterParam[(UB_LPC_ORDER + 1)*SUBFRAMES];

  double real_f[FRAMESAMPLES_HALF];
  double imag_f[FRAMESAMPLES_HALF];
  const int16_t kAveragePitchGain = 0; /* No pitch-gain for upper-band. */
  len = 0;

  /* Decode & dequantize filter coefficients. */
  err = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,
                                       percepFilterParam, isac12kHz);
  if (err < 0) {
    return err;
  }

  /* Decode & de-quantize spectrum. */
  len = WebRtcIsac_DecodeSpec(&ISACdecUB_obj->bitstr_obj, kAveragePitchGain,
                              kIsacUpperBand12, real_f, imag_f);
  if (len < 0) {
    return len;
  }

  if (isRCUPayload) {
    int n;
    for (n = 0; n < 240; n++) {
      real_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
      imag_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
    }
  }
  /* Inverse transform. */
  WebRtcIsac_Spec2time(transform_tables,
                       real_f, imag_f, LPw, HPw, &ISACdecUB_obj->fftstr_obj);
  /* perceptual post-filtering (using normalized lattice filter) */
  WebRtcIsac_NormLatticeFilterAr(UB_LPC_ORDER,
                                 ISACdecUB_obj->maskfiltstr_obj.PostStateLoF,
                                 (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG,
                                 LPw, percepFilterParam, LP_dec_float);
  /* Zero for 12-16 kHz. */
  memset(HP_dec_float, 0, sizeof(float) * (FRAMESAMPLES_HALF));
  /* Recombine the 2 bands. */
  WebRtcIsac_FilterAndCombineFloat(HP_dec_float, LP_dec_float, signal_out,
                                   &ISACdecUB_obj->postfiltbankstr_obj);
  return len;
}